

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

string * __thiscall kratos::FSM::output_table_abi_cxx11_(string *__return_storage_ptr__,FSM *this)

{
  bool bVar1;
  size_type __n;
  reference __args;
  iterator iVar2;
  iterator iVar3;
  reference __in;
  type *ptVar4;
  __shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
  *this_02;
  mapped_type *ppVVar5;
  ostream *poVar6;
  string local_2b8 [32];
  mapped_type local_298;
  Var *value;
  Var **output;
  iterator __end2;
  iterator __begin2;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *__range2;
  type *state;
  type *state_name;
  _Self local_258;
  iterator __end1_2;
  iterator __begin1_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>_>_>
  *__range1_2;
  reference local_220;
  Var **var;
  iterator __end1_1;
  iterator __begin1_1;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *__range1_1;
  pair<kratos::Var_*const,_kratos::Var_*> *iter;
  iterator __end1;
  iterator __begin1;
  unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
  *__range1;
  undefined1 local_1b8 [8];
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> outputs;
  stringstream stream;
  FSM *this_local;
  
  stream._384_8_ = this;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)
             &outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::vector
            ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)local_1b8);
  __n = std::
        unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
        ::size(&this->outputs_);
  std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::reserve
            ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)local_1b8,__n);
  __end1 = std::
           unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
           ::begin(&this->outputs_);
  iter = (pair<kratos::Var_*const,_kratos::Var_*> *)
         std::
         unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
         ::end(&this->outputs_);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<kratos::Var_*const,_kratos::Var_*>,_false>
                       ,(_Node_iterator_base<std::pair<kratos::Var_*const,_kratos::Var_*>,_false> *)
                        &iter);
    if (!bVar1) break;
    __args = std::__detail::
             _Node_iterator<std::pair<kratos::Var_*const,_kratos::Var_*>,_false,_false>::operator*
                       (&__end1);
    std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Var*const&>
              ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)local_1b8,&__args->first);
    std::__detail::_Node_iterator<std::pair<kratos::Var_*const,_kratos::Var_*>,_false,_false>::
    operator++(&__end1);
  }
  iVar2 = std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::begin
                    ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)local_1b8);
  iVar3 = std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::end
                    ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)local_1b8);
  std::
  sort<__gnu_cxx::__normal_iterator<kratos::Var**,std::vector<kratos::Var*,std::allocator<kratos::Var*>>>,kratos::FSM::output_table[abi:cxx11]()::__0>
            (iVar2._M_current,iVar3._M_current);
  std::operator<<((ostream *)&stream.field_0x8,"State");
  __end1_1 = std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::begin
                       ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)local_1b8);
  var = (Var **)std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::end
                          ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)local_1b8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
                        *)&var);
    if (!bVar1) break;
    local_220 = __gnu_cxx::
                __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
                ::operator*(&__end1_1);
    poVar6 = std::operator<<((ostream *)&stream.field_0x8,",");
    (*((*local_220)->super_IRNode)._vptr_IRNode[0x1f])(&__range1_2);
    std::operator<<(poVar6,(string *)&__range1_2);
    std::__cxx11::string::~string((string *)&__range1_2);
    __gnu_cxx::
    __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>::
    operator++(&__end1_1);
  }
  std::ostream::operator<<(&stream.field_0x8,std::endl<char,std::char_traits<char>>);
  __end1_2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>_>_>
             ::begin(&this->states_);
  local_258._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>_>_>
       ::end(&this->states_);
  while( true ) {
    bVar1 = std::operator!=(&__end1_2,&local_258);
    if (!bVar1) break;
    __in = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>_>
           ::operator*(&__end1_2);
    ptVar4 = std::get<0ul,std::__cxx11::string_const,std::shared_ptr<kratos::FSMState>>(__in);
    this_00 = (__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::get<1ul,std::__cxx11::string_const,std::shared_ptr<kratos::FSMState>>(__in);
    std::operator<<((ostream *)&stream.field_0x8,(string *)ptVar4);
    __end2 = std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::begin
                       ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)local_1b8);
    output = (Var **)std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::end
                               ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)local_1b8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
                                  *)&output);
      if (!bVar1) break;
      value = (Var *)__gnu_cxx::
                     __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
                     ::operator*(&__end2);
      this_01 = std::__shared_ptr_access<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(this_00);
      this_02 = FSMState::output_values(this_01);
      ppVVar5 = std::
                map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
                ::at(this_02,(key_type *)value);
      local_298 = *ppVVar5;
      poVar6 = std::operator<<((ostream *)&stream.field_0x8,",");
      (*(local_298->super_IRNode)._vptr_IRNode[0x1f])(local_2b8);
      std::operator<<(poVar6,local_2b8);
      std::__cxx11::string::~string(local_2b8);
      __gnu_cxx::
      __normal_iterator<kratos::Var_**,_std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>_>
      ::operator++(&__end2);
    }
    std::ostream::operator<<(&stream.field_0x8,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>_>
    ::operator++(&__end1_2);
  }
  std::__cxx11::stringstream::str();
  std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::~vector
            ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)local_1b8);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)
             &outputs.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::string FSM::output_table() {
    std::stringstream stream;
    // sort the outputs
    std::vector<Var*> outputs;
    outputs.reserve(outputs_.size());
    for (auto const& iter : outputs_) outputs.emplace_back(iter.first);
    std::sort(outputs.begin(), outputs.end(),
              [](const auto& lhs, const auto& rhs) { return lhs->to_string() < rhs->to_string(); });
    // write the header
    stream << "State";
    for (const auto& var : outputs) stream << "," << var->to_string();
    stream << ::endl;

    // notice that we don't need to sort the state names since it's stored in map
    // which is ordered
    for (auto const& [state_name, state] : states_) {
        stream << state_name;
        for (auto const& output : outputs) {
            auto* value = state->output_values().at(output);
            stream << "," << value->to_string();
        }
        stream << ::endl;
    }

    return stream.str();
}